

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdb_typetable.cpp
# Opt level: O0

void __thiscall TypeTable::TypeTable(TypeTable *this,TPIStream *tpiStream)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  size_t sVar3;
  DirectMSFStream *this_00;
  ulong uVar4;
  Record **ppRVar5;
  anon_class_16_2_8327b225 local_50;
  uint32_t local_3c;
  undefined1 local_38 [4];
  uint32_t typeIndex;
  DirectMSFStream *local_20;
  DirectMSFStream *directStream;
  TPIStream *tpiStream_local;
  TypeTable *this_local;
  
  directStream = &tpiStream->m_stream;
  tpiStream_local = (TPIStream *)this;
  uVar2 = PDB::TPIStream::GetFirstTypeIndex(tpiStream);
  this->typeIndexBegin = uVar2;
  uVar2 = PDB::TPIStream::GetLastTypeIndex((TPIStream *)directStream);
  this->typeIndexEnd = uVar2;
  sVar3 = PDB::TPIStream::GetTypeRecordCount((TPIStream *)directStream);
  this->m_recordCount = sVar3;
  PDB::CoalescedMSFStream::CoalescedMSFStream(&this->m_stream);
  this_00 = PDB::TPIStream::GetDirectMSFStream((TPIStream *)directStream);
  local_20 = this_00;
  uVar2 = PDB::DirectMSFStream::GetSize(this_00);
  PDB::CoalescedMSFStream::CoalescedMSFStream((CoalescedMSFStream *)local_38,this_00,uVar2,0);
  PDB::CoalescedMSFStream::operator=(&this->m_stream,(CoalescedMSFStream *)local_38);
  PDB::CoalescedMSFStream::~CoalescedMSFStream((CoalescedMSFStream *)local_38);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->m_recordCount;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  ppRVar5 = (Record **)operator_new__(uVar4);
  this->m_records = ppRVar5;
  local_3c = 0;
  local_50.typeIndex = &local_3c;
  local_50.this = this;
  PDB::TPIStream::ForEachTypeRecordHeaderAndOffset<TypeTable::TypeTable(PDB::TPIStream_const&)::__0>
            ((TPIStream *)directStream,&local_50);
  return;
}

Assistant:

TypeTable::TypeTable(const PDB::TPIStream& tpiStream) PDB_NO_EXCEPT
	: typeIndexBegin(tpiStream.GetFirstTypeIndex()), typeIndexEnd(tpiStream.GetLastTypeIndex()),
	m_recordCount(tpiStream.GetTypeRecordCount())
{
	// Create coalesced stream from TPI stream, so the records can be referenced directly using pointers.
	const PDB::DirectMSFStream& directStream = tpiStream.GetDirectMSFStream();
	m_stream = PDB::CoalescedMSFStream(directStream, directStream.GetSize(), 0);

	// types in the TPI stream are accessed by their index from other streams.
	// however, the index is not stored with types in the TPI stream directly, but has to be built while walking the stream.
	// similarly, because types are variable-length records, there are no direct offsets to access individual types.
	// we therefore walk the TPI stream once, and store pointers to the records for trivial O(1) array lookup by index later.	
	m_records = new const PDB::CodeView::TPI::Record*[m_recordCount];

	// parse the CodeView records
	uint32_t typeIndex = 0u;

	tpiStream.ForEachTypeRecordHeaderAndOffset([this, &typeIndex](const PDB::CodeView::TPI::RecordHeader& header, size_t offset)
		{
			// The header includes the record kind and size, which can be stored along with offset
			// to allow for lazy loading of the types on-demand directly from the TPIStream::GetDirectMSFStream()
			// using DirectMSFStream::ReadAtOffset(...). Thus not needing a CoalescedMSFStream to look up the types.
			(void)header;

			const PDB::CodeView::TPI::Record* record = m_stream.GetDataAtOffset<const PDB::CodeView::TPI::Record>(offset);
			m_records[typeIndex] = record;
			++typeIndex;
		});
}